

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_copy_tile_component_parameters(opj_j2k_t *p_j2k)

{
  opj_tccp_t *poVar1;
  opj_tccp_t *poVar2;
  uint uVar3;
  opj_tcp_t *local_48;
  opj_tccp_t *poStack_38;
  OPJ_UINT32 l_prc_size;
  opj_tccp_t *l_copied_tccp;
  opj_tccp_t *l_ref_tccp;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  OPJ_UINT32 i;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k != (opj_j2k_t *)0x0) {
    if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
      local_48 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
    }
    else {
      local_48 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    }
    poVar1 = local_48->tccps;
    uVar3 = poVar1->numresolutions << 2;
    poVar2 = poVar1;
    for (l_cp._4_4_ = 1; poStack_38 = poVar2 + 1, l_cp._4_4_ < p_j2k->m_private_image->numcomps;
        l_cp._4_4_ = l_cp._4_4_ + 1) {
      poVar2[1].numresolutions = poVar1->numresolutions;
      poVar2[1].cblkw = poVar1->cblkw;
      poVar2[1].cblkh = poVar1->cblkh;
      poVar2[1].cblksty = poVar1->cblksty;
      poVar2[1].qmfbid = poVar1->qmfbid;
      memcpy(poVar2[1].prcw,poVar1->prcw,(ulong)uVar3);
      memcpy(poVar2[1].prch,poVar1->prch,(ulong)uVar3);
      poVar2 = poStack_38;
    }
    return;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x2692,"void opj_j2k_copy_tile_component_parameters(opj_j2k_t *)");
}

Assistant:

static void opj_j2k_copy_tile_component_parameters(opj_j2k_t *p_j2k)
{
    /* loop */
    OPJ_UINT32 i;
    opj_cp_t *l_cp = NULL;
    opj_tcp_t *l_tcp = NULL;
    opj_tccp_t *l_ref_tccp = NULL, *l_copied_tccp = NULL;
    OPJ_UINT32 l_prc_size;

    /* preconditions */
    assert(p_j2k != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH)
            ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    l_ref_tccp = &l_tcp->tccps[0];
    l_copied_tccp = l_ref_tccp + 1;
    l_prc_size = l_ref_tccp->numresolutions * (OPJ_UINT32)sizeof(OPJ_UINT32);

    for (i = 1; i < p_j2k->m_private_image->numcomps; ++i) {
        l_copied_tccp->numresolutions = l_ref_tccp->numresolutions;
        l_copied_tccp->cblkw = l_ref_tccp->cblkw;
        l_copied_tccp->cblkh = l_ref_tccp->cblkh;
        l_copied_tccp->cblksty = l_ref_tccp->cblksty;
        l_copied_tccp->qmfbid = l_ref_tccp->qmfbid;
        memcpy(l_copied_tccp->prcw, l_ref_tccp->prcw, l_prc_size);
        memcpy(l_copied_tccp->prch, l_ref_tccp->prch, l_prc_size);
        ++l_copied_tccp;
    }
}